

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalSubsumption.cpp
# Opt level: O2

bool __thiscall
Inferences::GlobalSubsumption::perform
          (GlobalSubsumption *this,Clause *cl,Clause **replacement,ClauseIterator *premises)

{
  Unit **ppUVar1;
  Unit **ppUVar2;
  int iVar3;
  Clause *pCVar4;
  VirtualIterator<Kernel::Clause_*> local_28;
  
  if (perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)::prems ==
      '\0') {
    iVar3 = __cxa_guard_acquire(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                                 ::prems);
    if (iVar3 != 0) {
      perform::prems._cursor = (Unit **)0x0;
      perform::prems._end = (Unit **)0x0;
      perform::prems._capacity = 0;
      perform::prems._stack = (Unit **)0x0;
      __cxa_atexit(Lib::Stack<Kernel::Unit_*>::~Stack,&perform::prems,&__dso_handle);
      __cxa_guard_release(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                           ::prems);
    }
  }
  pCVar4 = perform(this,cl,&perform::prems);
  ppUVar2 = perform::prems._cursor;
  ppUVar1 = perform::prems._stack;
  if (pCVar4 != cl) {
    *replacement = pCVar4;
    local_28._core =
         (IteratorCore<Kernel::Clause_*> *)
         Lib::
         ProxyIterator<Kernel::Clause*,Lib::MappingIterator<Lib::Stack<Kernel::Unit*>::BottomFirstIterator,Inferences::GlobalSubsumption::Unit2ClFn,Kernel::Clause*>>
         ::operator_new(0x28);
    (local_28._core)->_vptr_IteratorCore = (_func_int **)&PTR__IteratorCore_009fb0a8;
    *(Unit ***)&local_28._core[1]._refCnt = ppUVar1;
    local_28._core[2]._vptr_IteratorCore = (_func_int **)ppUVar2;
    (local_28._core)->_refCnt = 1;
    Lib::VirtualIterator<Kernel::Clause_*>::operator=(premises,&local_28);
    Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator(&local_28);
  }
  return pCVar4 != cl;
}

Assistant:

bool GlobalSubsumption::perform(Clause* cl, Clause*& replacement, ClauseIterator& premises)
{
  static Stack<Unit*> prems;

  Clause* newCl = perform(cl,prems);
  if(newCl==cl) {
    return false;
  }

  Stack<Unit*>::BottomFirstIterator it(prems);

  replacement = newCl;
  premises = pvi( getMappingIterator(it, Unit2ClFn()) );
  return true;
}